

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::CompilerMSL::get_resource_array_size(CompilerMSL *this,SPIRType *type,uint32_t id)

{
  uint32_t uVar1;
  SPIREntryPoint *pSVar2;
  const_iterator cVar3;
  bool bVar4;
  StageSetBinding tuple;
  
  uVar1 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type);
  tuple.desc_set = Compiler::get_decoration((Compiler *)this,(ID)id,DecorationDescriptorSet);
  bVar4 = false;
  if ((tuple.desc_set < 8) && ((this->msl_options).argument_buffers != false)) {
    bVar4 = (this->argument_buffer_discrete_mask >> (tuple.desc_set & 0x1f) & 1) == 0;
  }
  if ((uVar1 == 0) || (bVar4)) {
    pSVar2 = Compiler::get_entry_point((Compiler *)this);
    tuple.model = pSVar2->model;
    tuple.binding = Compiler::get_decoration((Compiler *)this,(ID)id,DecorationBinding);
    cVar3 = ::std::
            _Hashtable<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->resource_bindings)._M_h,&tuple);
    if (cVar3.
        super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      uVar1 = *(uint32_t *)
               ((long)cVar3.
                      super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                      ._M_cur + 0x24);
    }
  }
  return uVar1;
}

Assistant:

uint32_t CompilerMSL::get_resource_array_size(const SPIRType &type, uint32_t id) const
{
	uint32_t array_size = to_array_size_literal(type);

	// If we have argument buffers, we need to honor the ABI by using the correct array size
	// from the layout. Only use shader declared size if we're not using argument buffers.
	uint32_t desc_set = get_decoration(id, DecorationDescriptorSet);
	if (!descriptor_set_is_argument_buffer(desc_set) && array_size)
		return array_size;

	StageSetBinding tuple = { get_entry_point().model, desc_set,
		                      get_decoration(id, DecorationBinding) };
	auto itr = resource_bindings.find(tuple);
	return itr != end(resource_bindings) ? itr->second.first.count : array_size;
}